

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O1

unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true> __thiscall
duckdb::HyperLogLog::Deserialize(HyperLogLog *this,Deserializer *deserializer)

{
  pointer pcVar1;
  HLLStorageType HVar2;
  uint uVar3;
  undefined8 *puVar4;
  tuple<duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_> tVar5;
  HLLV1 o;
  pointer pHVar6;
  uint64_t uVar7;
  type new_hll;
  SerializationException *this_00;
  pointer *__ptr;
  templated_unique_single_t old;
  string str;
  __uniq_ptr_impl<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>_> local_50;
  string local_48;
  
  puVar4 = (undefined8 *)operator_new(0x40);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[7] = 0;
  *(undefined8 **)this->k = puVar4;
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_48,deserializer);
    HVar2 = EnumUtil::FromString<duckdb::HLLStorageType>(local_48._M_dataplus._M_p);
    uVar3 = (uint)HVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    uVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  if ((char)uVar3 == '\x01') {
    tVar5.super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>.
    super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>)operator_new(8);
    o.hll = duckdb_hll::hll_create();
    *(robj **)tVar5.super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>.
              super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl = o.hll;
    duckdb_hll::hllSparseToDense(o.hll);
    local_50._M_t.super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>.
    super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl =
         (tuple<duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>)
         (tuple<duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>)
         tVar5.super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>.
         super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl;
    pHVar6 = unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->
                       ((unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true> *)
                        &local_50);
    pcVar1 = (pointer)pHVar6->hll->ptr;
    unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->
              ((unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true> *)&local_50);
    uVar7 = duckdb_hll::get_size();
    local_48._M_dataplus._M_p = pcVar1;
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"data");
    (*deserializer->_vptr_Deserializer[0x1b])(deserializer,&local_48,uVar7);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    pHVar6 = unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->
                       ((unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true> *)
                        &local_50);
    new_hll = unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>::
              operator*((unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>
                         *)this);
    HLLV1::ToNew(pHVar6,new_hll);
    if ((_Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>)
        local_50._M_t.super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>.
        super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl != (HLLV1 *)0x0) {
      ::std::default_delete<duckdb::HLLV1>::operator()
                ((default_delete<duckdb::HLLV1> *)&local_50,
                 (HLLV1 *)local_50._M_t.
                          super__Tuple_impl<0UL,_duckdb::HLLV1_*,_std::default_delete<duckdb::HLLV1>_>
                          .super__Head_base<0UL,_duckdb::HLLV1_*,_false>._M_head_impl);
    }
  }
  else {
    if ((uVar3 & 0xff) != 2) {
      this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unknown HyperLogLog storage type!","");
      SerializationException::SerializationException(this_00,&local_48);
      __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p =
         (pointer)unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>::
                  operator->((unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>
                              *)this);
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"data");
    (*deserializer->_vptr_Deserializer[0x1b])(deserializer,&local_48,0x40);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
  }
  return (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)
         (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)this;
}

Assistant:

unique_ptr<HyperLogLog> HyperLogLog::Deserialize(Deserializer &deserializer) {
	auto result = make_uniq<HyperLogLog>();
	auto storage_type = deserializer.ReadProperty<HLLStorageType>(100, "type");
	switch (storage_type) {
	case HLLStorageType::HLL_V1: {
		auto old = make_uniq<HLLV1>();
		deserializer.ReadProperty(101, "data", old->GetPtr(), old->GetSize());
		old->ToNew(*result);
		break;
	}
	case HLLStorageType::HLL_V2:
		deserializer.ReadProperty(101, "data", result->k, sizeof(k));
		break;
	default:
		throw SerializationException("Unknown HyperLogLog storage type!");
	}
	return result;
}